

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O2

int killpara(int f,int n)

{
  mgwin *pmVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 1;
  if (n != 0) {
    iVar2 = findpara();
    if (iVar2 != 0) {
      gotobop(8,1);
      pmVar1 = curwp;
      iVar2 = curwp->w_dotline;
      curwp->w_markp = curwp->w_dotp;
      pmVar1->w_marko = pmVar1->w_doto;
      gotoeop(8,n);
      iVar3 = killregion(8,1);
      if (iVar3 == 1) {
        curwp->w_dotline = iVar2;
        iVar3 = 1;
      }
    }
  }
  return iVar3;
}

Assistant:

int
killpara(int f, int n)
{
	int	lineno, status;

	if (n == 0)
		return (TRUE);

	if (findpara() == FALSE)
		return (TRUE);

	/* go to the beginning of the paragraph */
	(void)gotobop(FFRAND, 1);

	/* take a note of the line number for after deletions and set mark */
	lineno = curwp->w_dotline;
	curwp->w_markp = curwp->w_dotp;
	curwp->w_marko = curwp->w_doto;

	(void)gotoeop(FFRAND, n);

	if ((status = killregion(FFRAND, 1)) != TRUE)
		return (status);

	curwp->w_dotline = lineno;
	return (TRUE);
}